

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O2

bool __thiscall ON_Brep::IsValidTolerancesAndFlags(ON_Brep *this,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  char *format;
  ulong uVar9;
  
  uVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count
  ;
  uVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  uVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar4 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  uVar5 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  uVar9 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar9;
  }
  lVar7 = 0x34;
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    if ((*(int *)((long)&(((this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                           super_ON_ClassArray<ON_BrepVertex>.m_a)->super_ON_Point).
                         super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar7) != -1) &&
       (bVar6 = IsValidVertexTolerancesAndFlags(this,(int)uVar9,text_log), !bVar6)) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_V[%d] is invalid.\n";
      goto LAB_00432866;
    }
    lVar7 = lVar7 + 0x58;
  }
  uVar9 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar9;
  }
  lVar7 = 0x4c;
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    if ((*(int *)((long)&(((ON_CurveProxy *)
                          (&(((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                              super_ON_ClassArray<ON_BrepEdge>.m_a)->super_ON_CurveProxy).
                            m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                         super_ON_Object._vptr_ON_Object + lVar7) != -1) &&
       (bVar6 = IsValidEdgeTolerancesAndFlags(this,(int)uVar9,text_log), !bVar6)) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_E[%d] is invalid.\n";
      goto LAB_00432866;
    }
    lVar7 = lVar7 + 0x88;
  }
  uVar9 = 0;
  uVar8 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar8 = uVar9;
  }
  lVar7 = 0x2c;
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    if ((*(int *)((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_a)->m_face_uuid).Data4 + lVar7 + -0x5c) != -1) &&
       (bVar6 = IsValidFaceTolerancesAndFlags(this,(int)uVar9,text_log), !bVar6)) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_F[%d] is invalid.\n";
      goto LAB_00432866;
    }
    lVar7 = lVar7 + 0xd8;
  }
  uVar9 = 0;
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar8 = uVar9;
  }
  lVar7 = 0x4c;
  do {
    if (uVar8 == uVar9) {
      uVar9 = 0;
      uVar8 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar8 = uVar9;
      }
      lVar7 = 0x1c;
      while( true ) {
        if (uVar8 == uVar9) {
          return true;
        }
        if ((*(int *)((long)&(((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                               super_ON_ClassArray<ON_BrepLoop>.m_a)->super_ON_Geometry).
                             super_ON_Object._vptr_ON_Object + lVar7) != -1) &&
           (bVar6 = IsValidLoopTolerancesAndFlags(this,(int)uVar9,text_log), !bVar6)) break;
        uVar9 = uVar9 + 1;
        lVar7 = lVar7 + 0x78;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_L[%d] is invalid.\n";
LAB_00432866:
      ON_TextLog::Print(text_log,format,uVar9 & 0xffffffff);
      return false;
    }
    if ((*(int *)((long)&(((ON_CurveProxy *)
                          (&(((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                              super_ON_ClassArray<ON_BrepTrim>.m_a)->super_ON_CurveProxy).
                            m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                         super_ON_Object._vptr_ON_Object + lVar7) != -1) &&
       (bVar6 = IsValidTrimTolerancesAndFlags(this,(int)uVar9,text_log), !bVar6)) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_T[%d] is invalid.\n";
      goto LAB_00432866;
    }
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 0xe8;
  } while( true );
}

Assistant:

bool
ON_Brep::IsValidTolerancesAndFlags( ON_TextLog* text_log ) const
{
  const int vertex_count  = m_V.Count();
  const int edge_count    = m_E.Count();
  const int trim_count    = m_T.Count();
  const int loop_count    = m_L.Count();
  const int face_count    = m_F.Count();

  int vi, ei, fi, ti, li;

  // check vertices
  for ( vi = 0; vi < vertex_count; vi++ ) {
    if ( m_V[vi].m_vertex_index == -1 )
      continue;
    if ( !IsValidVertexTolerancesAndFlags( vi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_V[%d] is invalid.\n",vi);
      return false;
    }
  }

  // check edges
  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
      continue;
    if ( !IsValidEdgeTolerancesAndFlags( ei, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_E[%d] is invalid.\n",ei);
      return false;
    }
  }

  // check faces
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
      continue;
    if ( !IsValidFaceTolerancesAndFlags( fi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_F[%d] is invalid.\n",fi);
      return false;
    }
  }

  // check trims
  for ( ti = 0; ti < trim_count; ti++ )
  {
    if ( m_T[ti].m_trim_index == -1 )
      continue;
    if ( !IsValidTrimTolerancesAndFlags( ti, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_T[%d] is invalid.\n",ti);
      return false;
    }
  }

  // check loops
  for ( li = 0; li < loop_count; li++ )
  {
    if ( m_L[li].m_loop_index == -1 )
      continue;
    if ( !IsValidLoopTolerancesAndFlags( li, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d] is invalid.\n",li);
      return false;
    }
  }

  return true;
}